

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O2

HullError __thiscall
HullLibrary::CreateConvexHull(HullLibrary *this,HullDesc *desc,HullResult *result)

{
  undefined8 uVar1;
  bool bVar2;
  uint *puVar3;
  uint i;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  HullError HVar7;
  uint *puVar8;
  undefined1 auVar9 [16];
  uint ovcount;
  PHullResult hr;
  cbtVector3 local_80;
  cbtAlignedObjectArray<cbtVector3> vertexScratch;
  cbtVector3 scale;
  cbtAlignedObjectArray<cbtVector3> vertexSource;
  
  hr.m_Indices.m_ownsMemory = true;
  hr.m_Indices.m_data = (uint *)0x0;
  hr.m_Indices.m_size = 0;
  hr.m_Indices.m_capacity = 0;
  hr.mVcount = 0;
  hr.mIndexCount = 0;
  hr.mFaceCount = 0;
  hr.mVertices = (cbtVector3 *)0x0;
  vertexSource.m_ownsMemory = true;
  vertexSource.m_data = (cbtVector3 *)0x0;
  vertexSource.m_size = 0;
  vertexSource.m_capacity = 0;
  uVar5 = 8;
  if (8 < desc->mVcount) {
    uVar5 = desc->mVcount;
  }
  cbtAlignedObjectArray<cbtVector3>::resize(&vertexSource,uVar5,(cbtVector3 *)&vertexScratch);
  bVar2 = CleanupVertices(this,desc->mVcount,desc->mVertices,desc->mVertexStride,&ovcount,
                          vertexSource.m_data,desc->mNormalEpsilon,&scale);
  HVar7 = QE_FAIL;
  if (bVar2) {
    uVar5 = 0;
    while (ovcount != uVar5) {
      auVar9._0_4_ = scale.m_floats[0] *
                     (float)*(undefined8 *)vertexSource.m_data[(int)uVar5].m_floats;
      auVar9._4_4_ = scale.m_floats[1] *
                     (float)((ulong)*(undefined8 *)vertexSource.m_data[(int)uVar5].m_floats >> 0x20)
      ;
      auVar9._8_8_ = 0;
      uVar1 = vmovlps_avx(auVar9);
      *(undefined8 *)vertexSource.m_data[(int)uVar5].m_floats = uVar1;
      vertexSource.m_data[(int)uVar5].m_floats[2] =
           scale.m_floats[2] * vertexSource.m_data[(int)uVar5].m_floats[2];
      uVar5 = uVar5 + 1;
    }
    bVar2 = ComputeHull(this,ovcount,vertexSource.m_data,&hr,desc->mMaxVertices);
    if (bVar2) {
      vertexScratch.m_ownsMemory = true;
      vertexScratch.m_data = (cbtVector3 *)0x0;
      vertexScratch.m_size = 0;
      vertexScratch.m_capacity = 0;
      cbtAlignedObjectArray<cbtVector3>::resize(&vertexScratch,hr.mVcount,&local_80);
      BringOutYourDead(this,hr.mVertices,hr.mVcount,vertexScratch.m_data,&ovcount,
                       hr.m_Indices.m_data,hr.mIndexCount);
      if ((desc->mFlags & 1) == 0) {
        result->mPolygons = true;
        result->mNumOutputVertices = ovcount;
        cbtAlignedObjectArray<cbtVector3>::resize(&result->m_OutputVertices,ovcount,&local_80);
        result->mNumFaces = hr.mFaceCount;
        result->mNumIndices = hr.mFaceCount + hr.mIndexCount;
        local_80.m_floats[0] = 0.0;
        cbtAlignedObjectArray<unsigned_int>::resize
                  (&result->m_Indices,hr.mFaceCount + hr.mIndexCount,(uint *)&local_80);
        memcpy((result->m_OutputVertices).m_data,vertexScratch.m_data,(ulong)ovcount << 4);
        puVar4 = (result->m_Indices).m_data + 2;
        puVar3 = hr.m_Indices.m_data;
        for (uVar5 = 0; uVar5 < hr.mFaceCount; uVar5 = uVar5 + 1) {
          puVar4[-2] = 3;
          if ((desc->mFlags & 2) == 0) {
            puVar4[-1] = *puVar3;
            *puVar4 = puVar3[1];
            puVar8 = puVar3 + 2;
          }
          else {
            puVar4[-1] = puVar3[2];
            *puVar4 = puVar3[1];
            puVar8 = puVar3;
          }
          puVar3 = puVar3 + 3;
          puVar4[1] = *puVar8;
          puVar4 = puVar4 + 4;
        }
      }
      else {
        result->mPolygons = false;
        result->mNumOutputVertices = ovcount;
        cbtAlignedObjectArray<cbtVector3>::resize(&result->m_OutputVertices,ovcount,&local_80);
        result->mNumFaces = hr.mFaceCount;
        result->mNumIndices = hr.mIndexCount;
        local_80.m_floats[0] = 0.0;
        cbtAlignedObjectArray<unsigned_int>::resize
                  (&result->m_Indices,hr.mIndexCount,(uint *)&local_80);
        memcpy((result->m_OutputVertices).m_data,vertexScratch.m_data,(ulong)ovcount << 4);
        if ((desc->mFlags & 2) == 0) {
          memcpy((result->m_Indices).m_data,hr.m_Indices.m_data,((ulong)hr._0_8_ >> 0x20) << 2);
        }
        else {
          puVar3 = (result->m_Indices).m_data;
          lVar6 = 0;
          for (uVar5 = 0; uVar5 < hr.mFaceCount; uVar5 = uVar5 + 1) {
            *(undefined4 *)((long)puVar3 + lVar6) =
                 *(undefined4 *)((long)hr.m_Indices.m_data + lVar6 + 8);
            *(undefined4 *)((long)puVar3 + lVar6 + 4) =
                 *(undefined4 *)((long)hr.m_Indices.m_data + lVar6 + 4);
            *(undefined4 *)((long)puVar3 + lVar6 + 8) =
                 *(undefined4 *)((long)hr.m_Indices.m_data + lVar6);
            lVar6 = lVar6 + 0xc;
          }
        }
      }
      ReleaseHull(&hr);
      cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&vertexScratch);
      HVar7 = QE_OK;
    }
  }
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&vertexSource);
  cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray(&hr.m_Indices);
  return HVar7;
}

Assistant:

HullError HullLibrary::CreateConvexHull(const HullDesc &desc,  // describes the input request
										HullResult &result)    // contains the resulst
{
	HullError ret = QE_FAIL;

	PHullResult hr;

	unsigned int vcount = desc.mVcount;
	if (vcount < 8) vcount = 8;

	cbtAlignedObjectArray<cbtVector3> vertexSource;
	vertexSource.resize(static_cast<int>(vcount));

	cbtVector3 scale;

	unsigned int ovcount;

	bool ok = CleanupVertices(desc.mVcount, desc.mVertices, desc.mVertexStride, ovcount, &vertexSource[0], desc.mNormalEpsilon, scale);  // normalize point cloud, remove duplicates!

	if (ok)
	{
		//		if ( 1 ) // scale vertices back to their original size.
		{
			for (unsigned int i = 0; i < ovcount; i++)
			{
				cbtVector3 &v = vertexSource[static_cast<int>(i)];
				v[0] *= scale[0];
				v[1] *= scale[1];
				v[2] *= scale[2];
			}
		}

		ok = ComputeHull(ovcount, &vertexSource[0], hr, desc.mMaxVertices);

		if (ok)
		{
			// re-index triangle mesh so it refers to only used vertices, rebuild a new vertex table.
			cbtAlignedObjectArray<cbtVector3> vertexScratch;
			vertexScratch.resize(static_cast<int>(hr.mVcount));

			BringOutYourDead(hr.mVertices, hr.mVcount, &vertexScratch[0], ovcount, &hr.m_Indices[0], hr.mIndexCount);

			ret = QE_OK;

			if (desc.HasHullFlag(QF_TRIANGLES))  // if he wants the results as triangle!
			{
				result.mPolygons = false;
				result.mNumOutputVertices = ovcount;
				result.m_OutputVertices.resize(static_cast<int>(ovcount));
				result.mNumFaces = hr.mFaceCount;
				result.mNumIndices = hr.mIndexCount;

				result.m_Indices.resize(static_cast<int>(hr.mIndexCount));

				memcpy(&result.m_OutputVertices[0], &vertexScratch[0], sizeof(cbtVector3) * ovcount);

				if (desc.HasHullFlag(QF_REVERSE_ORDER))
				{
					const unsigned int *source = &hr.m_Indices[0];
					unsigned int *dest = &result.m_Indices[0];

					for (unsigned int i = 0; i < hr.mFaceCount; i++)
					{
						dest[0] = source[2];
						dest[1] = source[1];
						dest[2] = source[0];
						dest += 3;
						source += 3;
					}
				}
				else
				{
					memcpy(&result.m_Indices[0], &hr.m_Indices[0], sizeof(unsigned int) * hr.mIndexCount);
				}
			}
			else
			{
				result.mPolygons = true;
				result.mNumOutputVertices = ovcount;
				result.m_OutputVertices.resize(static_cast<int>(ovcount));
				result.mNumFaces = hr.mFaceCount;
				result.mNumIndices = hr.mIndexCount + hr.mFaceCount;
				result.m_Indices.resize(static_cast<int>(result.mNumIndices));
				memcpy(&result.m_OutputVertices[0], &vertexScratch[0], sizeof(cbtVector3) * ovcount);

				//				if ( 1 )
				{
					const unsigned int *source = &hr.m_Indices[0];
					unsigned int *dest = &result.m_Indices[0];
					for (unsigned int i = 0; i < hr.mFaceCount; i++)
					{
						dest[0] = 3;
						if (desc.HasHullFlag(QF_REVERSE_ORDER))
						{
							dest[1] = source[2];
							dest[2] = source[1];
							dest[3] = source[0];
						}
						else
						{
							dest[1] = source[0];
							dest[2] = source[1];
							dest[3] = source[2];
						}

						dest += 4;
						source += 3;
					}
				}
			}
			ReleaseHull(hr);
		}
	}

	return ret;
}